

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O1

void uv__write_int(int fd,int val)

{
  ssize_t sVar1;
  int *piVar2;
  undefined1 local_14 [4];
  
  do {
    sVar1 = write(fd,local_14,4);
    if (sVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  _exit(0x7f);
}

Assistant:

static void uv__write_int(int fd, int val) {
  ssize_t n;

  do
    n = write(fd, &val, sizeof(val));
  while (n == -1 && errno == EINTR);

  /* The write might have failed (e.g. if the parent process has died),
   * but we have nothing left but to _exit ourself now too. */
  _exit(127);
}